

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time_detail.h
# Opt level: O1

fields absl::lts_20250127::time_internal::cctz::detail::impl::n_min
                 (year_t y,diff_t m,diff_t d,diff_t hh,diff_t ch,diff_t mm,second_t ss)

{
  char hh_00;
  char mm_00;
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  fields fVar5;
  
  lVar2 = mm % 0x3c;
  lVar3 = (lVar2 >> 0x3f) + ch + mm / 0x3c;
  lVar1 = (hh / 6 + (hh >> 0x3f) >> 2) - (hh >> 0x3f);
  lVar4 = lVar3 % 0x18 + hh + lVar1 * -0x18;
  mm_00 = (char)lVar2 + '<';
  if (-1 < lVar2) {
    mm_00 = (char)lVar2;
  }
  lVar2 = lVar4 % 0x18;
  hh_00 = (char)lVar2 + '\x18';
  if (-1 < lVar2) {
    hh_00 = (char)lVar2;
  }
  fVar5 = n_mon(y,m,d,(lVar2 >> 0x3f) + lVar3 / 0x18 + lVar1 + lVar4 / 0x18,hh_00,mm_00,ss);
  fVar5._8_8_ = fVar5._8_8_ & 0xffffffffff;
  return fVar5;
}

Assistant:

CONSTEXPR_F fields n_min(year_t y, diff_t m, diff_t d, diff_t hh, diff_t ch,
                         diff_t mm, second_t ss) noexcept {
  ch += mm / 60;
  mm %= 60;
  if (mm < 0) {
    ch -= 1;
    mm += 60;
  }
  return n_hour(y, m, d, hh / 24 + ch / 24, hh % 24 + ch % 24,
                static_cast<minute_t>(mm), ss);
}